

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxPrinter.cpp
# Opt level: O3

SyntaxPrinter * __thiscall slang::syntax::SyntaxPrinter::print(SyntaxPrinter *this,SyntaxNode *node)

{
  size_t sVar1;
  SyntaxNode *node_00;
  size_t index;
  Token token;
  
  sVar1 = SyntaxNode::getChildCount(node);
  if (sVar1 != 0) {
    index = 0;
    do {
      node_00 = SyntaxNode::childNode(node,index);
      if (node_00 == (SyntaxNode *)0x0) {
        token = SyntaxNode::childToken(node,index);
        if (token.info != (Info *)0x0) {
          print(this,token);
        }
      }
      else {
        print(this,node_00);
      }
      index = index + 1;
    } while (sVar1 != index);
  }
  return this;
}

Assistant:

SyntaxPrinter& SyntaxPrinter::print(const SyntaxNode& node) {
    size_t childCount = node.getChildCount();
    for (size_t i = 0; i < childCount; i++) {
        if (auto childNode = node.childNode(i); childNode)
            print(*childNode);
        else if (auto token = node.childToken(i); token)
            print(token);
    }
    return *this;
}